

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

bool __thiscall Character::DelSpell(Character *this,short spell)

{
  iterator local_60;
  const_iterator local_58;
  const_iterator local_50;
  _Self local_48;
  byte local_39;
  anon_class_8_1_a8a2f048_for__M_pred aStack_38;
  bool removed;
  _List_node_base *local_30;
  _List_iterator<Character_Spell> local_28;
  _Self local_20;
  _List_iterator<Character_Spell> remove_it;
  short spell_local;
  Character *this_local;
  
  remove_it._M_node._6_2_ = spell;
  local_28._M_node =
       (_List_node_base *)
       std::begin<std::__cxx11::list<Character_Spell,std::allocator<Character_Spell>>>
                 (&this->spells);
  local_30 = (_List_node_base *)
             std::end<std::__cxx11::list<Character_Spell,std::allocator<Character_Spell>>>
                       (&this->spells);
  aStack_38.spell = (short *)((long)&remove_it._M_node + 6);
  local_20._M_node =
       (_List_node_base *)
       std::remove_if<std::_List_iterator<Character_Spell>,Character::DelSpell(short)::__0>
                 (local_28,(_List_iterator<Character_Spell>)local_30,aStack_38);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::end(&this->spells);
  local_39 = std::operator!=(&local_20,&local_48);
  std::_List_const_iterator<Character_Spell>::_List_const_iterator(&local_50,&local_20);
  local_60._M_node =
       (_List_node_base *)
       std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::end(&this->spells);
  std::_List_const_iterator<Character_Spell>::_List_const_iterator(&local_58,&local_60);
  std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::erase
            (&this->spells,local_50,local_58);
  CheckQuestRules(this);
  return (bool)(local_39 & 1);
}

Assistant:

bool Character::DelSpell(short spell)
{
	auto remove_it = std::remove_if(UTIL_RANGE(this->spells), [&](Character_Spell cs) { return cs.id == spell; });
	bool removed = (remove_it != this->spells.end());
	this->spells.erase(remove_it, this->spells.end());

	this->CheckQuestRules();

	return removed;
}